

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spritesheet.cc
# Opt level: O0

vector<Image,_std::allocator<Image>_> *
LoadSpritesheet(vector<Image,_std::allocator<Image>_> *__return_storage_ptr__,string *filename)

{
  int iVar1;
  uchar *puVar2;
  const_pointer pvVar3;
  size_type sVar4;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  string *filename_local;
  
  data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)filename;
  ReadBinaryFile((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,filename);
  puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  pvVar3 = std::array<unsigned_char,_4UL>::data
                     ((array<unsigned_char,_4UL> *)&(anonymous_namespace)::cga_header);
  sVar4 = std::array<unsigned_char,_4UL>::size
                    ((array<unsigned_char,_4UL> *)&(anonymous_namespace)::cga_header);
  iVar1 = memcmp(puVar2,pvVar3,sVar4);
  if (iVar1 == 0) {
    anon_unknown.dwarf_971b::LoadCgaSpritesheet
              (__return_storage_ptr__,
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  }
  else {
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    pvVar3 = std::array<unsigned_char,_4UL>::data
                       ((array<unsigned_char,_4UL> *)&(anonymous_namespace)::ega_header);
    sVar4 = std::array<unsigned_char,_4UL>::size
                      ((array<unsigned_char,_4UL> *)&(anonymous_namespace)::ega_header);
    iVar1 = memcmp(puVar2,pvVar3,sVar4);
    if (iVar1 == 0) {
      anon_unknown.dwarf_971b::LoadEgaSpritesheet
                (__return_storage_ptr__,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    }
    else {
      memset(__return_storage_ptr__,0,0x18);
      std::vector<Image,_std::allocator<Image>_>::vector(__return_storage_ptr__);
    }
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Image> LoadSpritesheet(std::string const& filename) {
  auto const data = ReadBinaryFile(filename);
  if (memcmp(data.data(), cga_header.data(), cga_header.size()) == 0) {
    return LoadCgaSpritesheet(data);
  }
  if (memcmp(data.data(), ega_header.data(), ega_header.size()) == 0) {
    return LoadEgaSpritesheet(data);
  }
  return {};
}